

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_search.cc
# Opt level: O2

void __thiscall SequenceLabelerTask::SequenceLabelerTask(SequenceLabelerTask *this,vw *vw_obj)

{
  ostream *poVar1;
  
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::SearchTask(&this->
                super_SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ,vw_obj);
  (this->
  super_SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  )._vptr_SearchTask = (_func_int **)&PTR__SearchTask_002add30;
  Search::search::set_options
            ((this->
             super_SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ).sch,Search::AUTO_CONDITION_FEATURES | Search::AUTO_HAMMING_LOSS);
  poVar1 = std::operator<<((ostream *)&std::cerr,"num_actions = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

SequenceLabelerTask(vw& vw_obj)
    : SearchTask< vector<wt>, vector<uint32_t> >(vw_obj)    // must run parent constructor!
  { sch.set_options( Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES );
    HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    cerr << "num_actions = " << d->num_actions << endl;
  }